

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Header>::erase(QGenericArrayOps<Header> *this,Header *b,qsizetype n)

{
  qsizetype *pqVar1;
  Header *pHVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  Header *pHVar7;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar7 = b + n;
  pHVar2 = (this->super_QArrayDataPointer<Header>).ptr;
  if ((pHVar2 == b) && (pHVar7 != pHVar2 + (this->super_QArrayDataPointer<Header>).size)) {
    (this->super_QArrayDataPointer<Header>).ptr = pHVar7;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<Header>).size;
    if (pHVar7 != pHVar2 + lVar3) {
      do {
        pHVar7 = b + n + 1;
        local_40.this = (_Move_assign_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)b;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
          ::_S_vtable._M_arr
          [(long)(char)*(__index_type *)
                        ((long)&b[n].name.data.
                                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                        0x18) + 1]._M_data)
                  (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(b + n));
        pDVar4 = (b->value).d.d;
        (b->value).d.d = b[n].value.d.d;
        b[n].value.d.d = pDVar4;
        pcVar5 = (b->value).d.ptr;
        (b->value).d.ptr = b[n].value.d.ptr;
        b[n].value.d.ptr = pcVar5;
        qVar6 = (b->value).d.size;
        (b->value).d.size = b[n].value.d.size;
        b[n].value.d.size = qVar6;
        b = b + 1;
      } while (pHVar7 != pHVar2 + lVar3);
      pHVar7 = b + n;
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<Header>).size;
  *pqVar1 = *pqVar1 - n;
  std::_Destroy_aux<false>::__destroy<Header*>(b,pHVar7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }